

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O2

void __thiscall iqxmlrpc::http::Header::Header(Header *this,Verification_level lev)

{
  _Rb_tree_header *p_Var1;
  allocator<char> local_ba;
  allocator<char> local_b9;
  string local_b8;
  string local_98;
  Option_validator_fn local_78;
  Option_validator_fn local_58;
  Option_validator_fn local_38;
  
  this->_vptr_Header = (_func_int **)&PTR__Header_0019cb20;
  (this->head_line_)._M_dataplus._M_p = (pointer)&(this->head_line_).field_2;
  (this->head_line_)._M_string_length = 0;
  (this->head_line_).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->options_)._M_t._M_impl.super__Rb_tree_header;
  (this->options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->options_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->validators_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->validators_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->validators_)._M_t._M_impl.super__Rb_tree_header;
  (this->validators_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->validators_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->validators_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->ver_level_ = lev;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"connection",&local_b9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"close",&local_ba);
  set_option_default(this,&local_b8,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"content-length",(allocator<char> *)&local_98);
  local_38.
  super_function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  boost::function1<void,std::__cxx11::string_const&>::
  assign_to<void(*)(std::__cxx11::string_const&)>
            ((function1<void,std::__cxx11::string_const&> *)&local_38,validator::unsigned_number);
  register_validator(this,&local_b8,&local_38,HTTP_CHECK_WEAK);
  boost::
  function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_38.
                super_function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              );
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"expect",(allocator<char> *)&local_98);
  local_58.
  super_function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  boost::function1<void,std::__cxx11::string_const&>::
  assign_to<void(*)(std::__cxx11::string_const&)>
            ((function1<void,std::__cxx11::string_const&> *)&local_58,validator::expect_continue);
  register_validator(this,&local_b8,&local_58,HTTP_CHECK_WEAK);
  boost::
  function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_58.
                super_function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              );
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"content-type",(allocator<char> *)&local_98);
  local_78.
  super_function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  boost::function1<void,std::__cxx11::string_const&>::
  assign_to<void(*)(std::__cxx11::string_const&)>
            ((function1<void,std::__cxx11::string_const&> *)&local_78,validator::content_type);
  register_validator(this,&local_b8,&local_78,HTTP_CHECK_STRICT);
  boost::
  function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_78.
                super_function1<void,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              );
  std::__cxx11::string::~string((string *)&local_b8);
  return;
}

Assistant:

Header::Header(Verification_level lev):
  ver_level_(lev)
{
  set_option_default(names::connection, "close");
  register_validator(names::content_length, validator::unsigned_number, HTTP_CHECK_WEAK);
  register_validator(names::expect_continue, validator::expect_continue, HTTP_CHECK_WEAK);
  register_validator(names::content_type, validator::content_type, HTTP_CHECK_STRICT);
}